

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalTexture1DShadowOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float lod;
  int offset;
  float *pfVar1;
  float fVar2;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  pfVar1 = tcu::Vector<float,_4>::z(c->in);
  fVar2 = *pfVar1;
  pfVar1 = tcu::Vector<float,_4>::x(c->in);
  s = *pfVar1;
  lod = p->lod;
  offset = tcu::Vector<int,_3>::x(&p->offset);
  fVar2 = texture1DShadowOffset(c,fVar2,s,lod,offset);
  pfVar1 = tcu::Vector<float,_4>::x(&c->color);
  *pfVar1 = fVar2;
  return;
}

Assistant:

static void		evalTexture1DShadowOffset			(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture1DShadowOffset(c, c.in[0].z(), c.in[0].x(), p.lod, p.offset.x()); }